

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O2

result_type_conflict __thiscall
anon_unknown.dwarf_10e53fd::IsInvalidName::operator()(IsInvalidName *this,QString *name)

{
  bool bVar1;
  char *what;
  
  if (*(long *)(this + 0x10) == 0) {
    what = "be empty";
  }
  else if (**(short **)(this + 8) == 0x2d) {
    what = "start with a \'-\'";
  }
  else if (**(short **)(this + 8) == 0x2f) {
    what = "start with a \'/\'";
  }
  else {
    bVar1 = QString::contains((QString *)this,(QChar)0x3d,CaseSensitive);
    if (!bVar1) {
      return false;
    }
    what = "contain a \'=\'";
  }
  warn(what);
  return true;
}

Assistant:

operator()(const QString &name) const noexcept
        {
            if (Q_UNLIKELY(name.isEmpty()))
                return warn("be empty");

            const QChar c = name.at(0);
            if (Q_UNLIKELY(c == u'-'))
                return warn("start with a '-'");
            if (Q_UNLIKELY(c == u'/'))
                return warn("start with a '/'");
            if (Q_UNLIKELY(name.contains(u'=')))
                return warn("contain a '='");

            return false;
        }